

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "Usage: \n-v version\n-h help\n-f input stream = fm\n-g input stream = gul coverage\n-c input stream = gul coverage\n-i input stream = gul item\n-p input path\n-m reduce downstream memory use with index file(s)\n-z output zeros\n-[summarysetid] outfilepipe\nwhere summarysetid range is 0 to 9\n"
         );
  return;
}

Assistant:

void help()
{

	fprintf(stderr,
		"Usage: \n"
		"-v version\n"
		"-h help\n"
		"-f input stream = fm\n"
		"-g input stream = gul coverage\n"
		"-c input stream = gul coverage\n"
		"-i input stream = gul item\n"
		"-p input path\n"
		"-m reduce downstream memory use with index file(s)\n"
		"-z output zeros\n"
		"-[summarysetid] outfilepipe\n"
		"where summarysetid range is 0 to 9\n"
	);
		;
}